

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2c.cc
# Opt level: O2

Result Wasm2cMain(Errors *errors)

{
  Stream *h_impl_stream_00;
  _Alloc_hider _Var1;
  pointer pFVar2;
  Result RVar3;
  wabt *this;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RCX;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  Enum EVar4;
  uint i;
  uint __val;
  FileStream *s;
  pointer pFVar5;
  string_view filename;
  string_view filename_00;
  string_view filename_01;
  string_view filename_02;
  string_view filename_03;
  string_view filename_04;
  string_view filename_05;
  string_view filename_06;
  string_view filename_07;
  string_view sVar6;
  string_view sVar7;
  allocator<char> local_59a;
  allocator<char> local_599;
  vector<wabt::FileStream,_std::allocator<wabt::FileStream>_> c_streams;
  string header_name_full;
  string_view header_name;
  FileStream h_stream;
  vector<wabt::Stream_*,_std::allocator<wabt::Stream_*>_> c_stream_ptrs;
  vector<unsigned_char,_std::allocator<unsigned_char>_> file_data;
  FileStream h_impl_stream;
  string header_impl_name_full;
  string local_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  string_view header_impl_name;
  ReadBinaryOptions options;
  Module module;
  
  _Var1._M_p = s_infile_abi_cxx11_._M_dataplus._M_p;
  if (s_num_outputs == 0) {
    fwrite("Number of output files must be positive.\n",0x29,1,_stderr);
    EVar4 = Error;
  }
  else {
    file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this = (wabt *)strlen(s_infile_abi_cxx11_._M_dataplus._M_p);
    sVar6._M_str = (char *)&file_data;
    sVar6._M_len = (size_t)_Var1._M_p;
    RVar3 = wabt::ReadFile(this,sVar6,in_RCX);
    if (RVar3.enum_ == Error) {
      EVar4 = Error;
    }
    else {
      wabt::Module::Module(&module);
      options.read_debug_names = (bool)(s_read_debug_names ^ 1);
      options.features.exceptions_enabled_ = s_write_c_options.features.exceptions_enabled_;
      options.features.mutable_globals_enabled_ =
           s_write_c_options.features.mutable_globals_enabled_;
      options.features.sat_float_to_int_enabled_ =
           s_write_c_options.features.sat_float_to_int_enabled_;
      options.features.sign_extension_enabled_ = s_write_c_options.features.sign_extension_enabled_;
      options.features.simd_enabled_ = s_write_c_options.features.simd_enabled_;
      options.features.threads_enabled_ = s_write_c_options.features.threads_enabled_;
      options.features.function_references_enabled_ =
           s_write_c_options.features.function_references_enabled_;
      options.features.multi_value_enabled_ = s_write_c_options.features.multi_value_enabled_;
      options.features.tail_call_enabled_ = s_write_c_options.features.tail_call_enabled_;
      options.features.bulk_memory_enabled_ = s_write_c_options.features.bulk_memory_enabled_;
      options.features.reference_types_enabled_ =
           s_write_c_options.features.reference_types_enabled_;
      options.features.annotations_enabled_ = s_write_c_options.features.annotations_enabled_;
      options.features.code_metadata_enabled_ = s_write_c_options.features.code_metadata_enabled_;
      options.features.gc_enabled_ = s_write_c_options.features.gc_enabled_;
      options.features.memory64_enabled_ = s_write_c_options.features.memory64_enabled_;
      options.features.multi_memory_enabled_ = s_write_c_options.features.multi_memory_enabled_;
      options.features.extended_const_enabled_ = s_write_c_options.features.extended_const_enabled_;
      options.features.relaxed_simd_enabled_ = s_write_c_options.features.relaxed_simd_enabled_;
      options.features.custom_page_sizes_enabled_ =
           s_write_c_options.features.custom_page_sizes_enabled_;
      options.log_stream =
           (Stream *)
           s_log_stream._M_t.
           super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>._M_t.
           super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
           super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl;
      options.stop_on_first_error = true;
      options.fail_on_custom_section_error = true;
      options.skip_function_bodies = false;
      RVar3 = wabt::ReadBinaryIr(s_infile_abi_cxx11_._M_dataplus._M_p,
                                 file_data.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start,
                                 (long)file_data.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)file_data.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start,&options,errors,
                                 &module);
      EVar4 = Error;
      if (RVar3.enum_ != Error) {
        h_stream.super_Stream._vptr_Stream = (_func_int **)s_write_c_options.features._0_8_;
        h_stream.super_Stream.offset_._0_1_ = s_write_c_options.features.tail_call_enabled_;
        h_stream.super_Stream.offset_._1_1_ = s_write_c_options.features.bulk_memory_enabled_;
        h_stream.super_Stream.offset_._2_1_ = s_write_c_options.features.reference_types_enabled_;
        h_stream.super_Stream.offset_._3_1_ = s_write_c_options.features.annotations_enabled_;
        h_stream.super_Stream.offset_._4_1_ = s_write_c_options.features.code_metadata_enabled_;
        h_stream.super_Stream.offset_._5_1_ = s_write_c_options.features.gc_enabled_;
        h_stream.super_Stream.offset_._6_1_ = s_write_c_options.features.memory64_enabled_;
        h_stream.super_Stream._15_4_ = s_write_c_options.features._15_4_;
        RVar3 = wabt::ValidateModule(&module,errors,(ValidateOptions *)&h_stream);
        if (RVar3.enum_ != Error) {
          RVar3 = wabt::GenerateNames(&module,None);
          if (RVar3.enum_ != Error) {
            wabt::ApplyNames(&module);
            if (s_outfile_abi_cxx11_._M_string_length == 0) {
              wabt::FileStream::FileStream(&h_stream,_stdout,(Stream *)0x0);
              h_impl_stream.super_Stream._0_16_ = ZEXT816(0);
              h_impl_stream.super_Stream.result_.enum_ = Ok;
              h_impl_stream.super_Stream._20_4_ = 0;
              header_name_full._M_dataplus._M_p = (pointer)&h_stream;
              std::vector<wabt::Stream*,std::allocator<wabt::Stream*>>::
              _M_range_initialize<wabt::Stream*const*>
                        ((vector<wabt::Stream*,std::allocator<wabt::Stream*>> *)&h_impl_stream,
                         &header_name_full);
              RVar3 = wabt::WriteC((vector<wabt::Stream_*,_std::allocator<wabt::Stream_*>_> *)
                                   &h_impl_stream,&h_stream.super_Stream,&h_stream.super_Stream,
                                   "wasm.h","",&module,&s_write_c_options);
              EVar4 = (Enum)(RVar3.enum_ == Error);
              std::_Vector_base<wabt::Stream_*,_std::allocator<wabt::Stream_*>_>::~_Vector_base
                        ((_Vector_base<wabt::Stream_*,_std::allocator<wabt::Stream_*>_> *)
                         &h_impl_stream);
              wabt::FileStream::~FileStream(&h_stream);
            }
            else {
              filename._M_str = extraout_RDX;
              filename._M_len = (size_t)s_outfile_abi_cxx11_._M_dataplus._M_p;
              h_impl_stream.super_Stream._0_16_ =
                   wabt::StripExtension((wabt *)s_outfile_abi_cxx11_._M_string_length,filename);
              std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                        ((string *)&h_stream,
                         (basic_string_view<char,_std::char_traits<char>_> *)&h_impl_stream,
                         (allocator<char> *)&header_impl_name_full);
              std::operator+(&header_name_full,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &h_stream,".h");
              std::__cxx11::string::_M_dispose();
              c_streams.super__Vector_base<wabt::FileStream,_std::allocator<wabt::FileStream>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              c_streams.super__Vector_base<wabt::FileStream,_std::allocator<wabt::FileStream>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              c_streams.super__Vector_base<wabt::FileStream,_std::allocator<wabt::FileStream>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              if (s_num_outputs == 1) {
                h_stream.super_Stream._vptr_Stream =
                     (_func_int **)s_outfile_abi_cxx11_._M_dataplus._M_p;
                std::vector<wabt::FileStream,std::allocator<wabt::FileStream>>::
                emplace_back<char_const*>
                          ((vector<wabt::FileStream,std::allocator<wabt::FileStream>> *)&c_streams,
                           (char **)&h_stream);
              }
              else {
                filename_00._M_str = extraout_RDX_00;
                filename_00._M_len = (size_t)s_outfile_abi_cxx11_._M_dataplus._M_p;
                h_impl_stream.super_Stream._0_16_ =
                     wabt::StripExtension((wabt *)s_outfile_abi_cxx11_._M_string_length,filename_00)
                ;
                std::__cxx11::string::
                string<std::basic_string_view<char,std::char_traits<char>>,void>
                          ((string *)&h_stream,
                           (basic_string_view<char,_std::char_traits<char>_> *)&h_impl_stream,
                           (allocator<char> *)&header_impl_name_full);
                for (__val = 0; __val < s_num_outputs; __val = __val + 1) {
                  std::operator+(&local_448,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&h_stream,"_");
                  std::__cxx11::to_string(&local_468,__val);
                  std::operator+(&header_impl_name_full,&local_448,&local_468);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&h_impl_stream,&header_impl_name_full,".c");
                  std::vector<wabt::FileStream,std::allocator<wabt::FileStream>>::
                  emplace_back<std::__cxx11::string>
                            ((vector<wabt::FileStream,std::allocator<wabt::FileStream>> *)&c_streams
                             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &h_impl_stream);
                  std::__cxx11::string::_M_dispose();
                  std::__cxx11::string::_M_dispose();
                  std::__cxx11::string::_M_dispose();
                  std::__cxx11::string::_M_dispose();
                }
                std::__cxx11::string::_M_dispose();
              }
              pFVar2 = c_streams.
                       super__Vector_base<wabt::FileStream,_std::allocator<wabt::FileStream>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
              c_stream_ptrs.super__Vector_base<wabt::Stream_*,_std::allocator<wabt::Stream_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              c_stream_ptrs.super__Vector_base<wabt::Stream_*,_std::allocator<wabt::Stream_*>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              c_stream_ptrs.super__Vector_base<wabt::Stream_*,_std::allocator<wabt::Stream_*>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              for (pFVar5 = c_streams.
                            super__Vector_base<wabt::FileStream,_std::allocator<wabt::FileStream>_>.
                            _M_impl.super__Vector_impl_data._M_start; pFVar5 != pFVar2;
                  pFVar5 = pFVar5 + 1) {
                h_stream.super_Stream._vptr_Stream = (_func_int **)pFVar5;
                std::vector<wabt::Stream*,std::allocator<wabt::Stream*>>::
                emplace_back<wabt::FileStream*>
                          ((vector<wabt::Stream*,std::allocator<wabt::Stream*>> *)&c_stream_ptrs,
                           (FileStream **)&h_stream);
              }
              filename_01._M_str = header_name_full._M_dataplus._M_p;
              filename_01._M_len = header_name_full._M_string_length;
              wabt::FileStream::FileStream(&h_stream,filename_01,(Stream *)0x0);
              filename_02._M_str = extraout_RDX_01;
              filename_02._M_len = (size_t)header_name_full._M_dataplus._M_p;
              header_name = wabt::GetBasename((wabt *)header_name_full._M_string_length,filename_02)
              ;
              sVar7._M_str = s_write_c_options.module_name._M_str;
              sVar7._M_len = s_write_c_options.module_name._M_len;
              filename_03._M_str = header_name._M_str;
              if (s_write_c_options.module_name._M_len == 0) {
                s_write_c_options.module_name._M_len = module.name._M_string_length;
                s_write_c_options.module_name._M_str = module.name._M_dataplus._M_p;
                sVar7._M_str = module.name._M_dataplus._M_p;
                sVar7._M_len = module.name._M_string_length;
                if (module.name._M_string_length == 0) {
                  filename_03._M_len = (size_t)s_infile_abi_cxx11_._M_dataplus._M_p;
                  sVar6 = wabt::GetBasename((wabt *)s_infile_abi_cxx11_._M_string_length,filename_03
                                           );
                  filename_04._M_str = sVar6._M_str;
                  filename_04._M_len = (size_t)filename_04._M_str;
                  sVar7 = wabt::StripExtension((wabt *)sVar6._M_len,filename_04);
                  filename_03._M_str = sVar7._M_str;
                }
              }
              s_write_c_options.module_name = sVar7;
              if (s_num_outputs == 1) {
                h_impl_stream_00 =
                     *c_stream_ptrs.
                      super__Vector_base<wabt::Stream_*,_std::allocator<wabt::Stream_*>_>._M_impl.
                      super__Vector_impl_data._M_start;
                std::__cxx11::string::
                string<std::basic_string_view<char,std::char_traits<char>>,void>
                          ((string *)&h_impl_stream,&header_name,
                           (allocator<char> *)&header_impl_name_full);
                RVar3 = wabt::WriteC(&c_stream_ptrs,&h_stream.super_Stream,h_impl_stream_00,
                                     (char *)h_impl_stream.super_Stream._vptr_Stream,"",&module,
                                     &s_write_c_options);
              }
              else {
                filename_05._M_str = filename_03._M_str;
                filename_05._M_len = (size_t)s_outfile_abi_cxx11_._M_dataplus._M_p;
                local_448._0_16_ =
                     wabt::StripExtension((wabt *)s_outfile_abi_cxx11_._M_string_length,filename_05)
                ;
                std::__cxx11::string::
                string<std::basic_string_view<char,std::char_traits<char>>,void>
                          ((string *)&h_impl_stream,
                           (basic_string_view<char,_std::char_traits<char>_> *)&local_448,
                           (allocator<char> *)&local_468);
                std::operator+(&header_impl_name_full,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &h_impl_stream,"-impl.h");
                std::__cxx11::string::_M_dispose();
                filename_06._M_str = header_impl_name_full._M_dataplus._M_p;
                filename_06._M_len = header_impl_name_full._M_string_length;
                wabt::FileStream::FileStream(&h_impl_stream,filename_06,(Stream *)0x0);
                filename_07._M_str = extraout_RDX_02;
                filename_07._M_len = (size_t)header_impl_name_full._M_dataplus._M_p;
                header_impl_name =
                     wabt::GetBasename((wabt *)header_impl_name_full._M_string_length,filename_07);
                std::__cxx11::string::
                string<std::basic_string_view<char,std::char_traits<char>>,void>
                          ((string *)&local_448,&header_name,&local_599);
                _Var1._M_p = local_448._M_dataplus._M_p;
                std::__cxx11::string::
                string<std::basic_string_view<char,std::char_traits<char>>,void>
                          ((string *)&local_468,&header_impl_name,&local_59a);
                RVar3 = wabt::WriteC(&c_stream_ptrs,&h_stream.super_Stream,
                                     &h_impl_stream.super_Stream,_Var1._M_p,
                                     local_468._M_dataplus._M_p,&module,&s_write_c_options);
                std::__cxx11::string::_M_dispose();
                std::__cxx11::string::_M_dispose();
                wabt::FileStream::~FileStream(&h_impl_stream);
              }
              std::__cxx11::string::_M_dispose();
              if (RVar3.enum_ == Error) {
                wabt::FileStream::~FileStream(&h_stream);
                std::_Vector_base<wabt::Stream_*,_std::allocator<wabt::Stream_*>_>::~_Vector_base
                          (&c_stream_ptrs.
                            super__Vector_base<wabt::Stream_*,_std::allocator<wabt::Stream_*>_>);
                std::vector<wabt::FileStream,_std::allocator<wabt::FileStream>_>::~vector
                          (&c_streams);
                std::__cxx11::string::_M_dispose();
              }
              else {
                wabt::FileStream::~FileStream(&h_stream);
                std::_Vector_base<wabt::Stream_*,_std::allocator<wabt::Stream_*>_>::~_Vector_base
                          (&c_stream_ptrs.
                            super__Vector_base<wabt::Stream_*,_std::allocator<wabt::Stream_*>_>);
                std::vector<wabt::FileStream,_std::allocator<wabt::FileStream>_>::~vector
                          (&c_streams);
                std::__cxx11::string::_M_dispose();
                EVar4 = Ok;
              }
            }
          }
        }
      }
      wabt::Module::~Module(&module);
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
  return (Result)EVar4;
}

Assistant:

Result Wasm2cMain(Errors& errors) {
  if (s_num_outputs < 1) {
    fprintf(stderr, "Number of output files must be positive.\n");
    return Result::Error;
  }

  std::vector<uint8_t> file_data;
  CHECK_RESULT(ReadFile(s_infile.c_str(), &file_data));

  Module module;
  const bool kStopOnFirstError = true;
  const bool kFailOnCustomSectionError = true;
  ReadBinaryOptions options(s_write_c_options.features, s_log_stream.get(),
                            s_read_debug_names, kStopOnFirstError,
                            kFailOnCustomSectionError);
  CHECK_RESULT(ReadBinaryIr(s_infile.c_str(), file_data.data(),
                            file_data.size(), options, &errors, &module));
  CHECK_RESULT(ValidateModule(&module, &errors, s_write_c_options.features));
  CHECK_RESULT(GenerateNames(&module));
  /* TODO(binji): This shouldn't fail; if a name can't be applied
   * (because the index is invalid, say) it should just be skipped. */
  ApplyNames(&module);

  if (!s_outfile.empty()) {
    std::string header_name_full =
        std::string(wabt::StripExtension(s_outfile)) + ".h";
    std::vector<FileStream> c_streams;
    if (s_num_outputs == 1) {
      c_streams.emplace_back(s_outfile.c_str());
    } else {
      std::string output_prefix{wabt::StripExtension(s_outfile)};
      for (unsigned int i = 0; i < s_num_outputs; i++) {
        c_streams.emplace_back(output_prefix + "_" + std::to_string(i) + ".c");
      }
    }
    std::vector<Stream*> c_stream_ptrs;
    for (auto& s : c_streams) {
      c_stream_ptrs.emplace_back(&s);
    }
    FileStream h_stream(header_name_full);
    std::string_view header_name = GetBasename(header_name_full);
    if (s_write_c_options.module_name.empty()) {
      s_write_c_options.module_name = module.name;
      if (s_write_c_options.module_name.empty()) {
        // In the absence of module name in the names section use the filename.
        s_write_c_options.module_name = StripExtension(GetBasename(s_infile));
      }
    }
    if (s_num_outputs == 1) {
      CHECK_RESULT(WriteC(std::move(c_stream_ptrs), &h_stream, c_stream_ptrs[0],
                          std::string(header_name).c_str(), "", &module,
                          s_write_c_options));
    } else {
      std::string header_impl_name_full =
          std::string(wabt::StripExtension(s_outfile)) + "-impl.h";
      FileStream h_impl_stream(header_impl_name_full);
      std::string_view header_impl_name = GetBasename(header_impl_name_full);
      CHECK_RESULT(WriteC(std::move(c_stream_ptrs), &h_stream, &h_impl_stream,
                          std::string(header_name).c_str(),
                          std::string(header_impl_name).c_str(), &module,
                          s_write_c_options));
    }
  } else {
    FileStream stream(stdout);
    CHECK_RESULT(WriteC({&stream}, &stream, &stream, "wasm.h", "", &module,
                        s_write_c_options));
  }

  return Result::Ok;
}